

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RenameFieldInfo::Deserialize(RenameFieldInfo *this,Deserializer *deserializer)

{
  RenameFieldInfo *this_00;
  pointer pRVar1;
  _Head_base<0UL,_duckdb::RenameFieldInfo_*,_false> local_20;
  
  this_00 = (RenameFieldInfo *)operator_new(0xb0);
  RenameFieldInfo(this_00);
  local_20._M_head_impl = this_00;
  pRVar1 = unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,400,"column_path",&pRVar1->column_path);
  pRVar1 = unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x191,"new_name",&pRVar1->new_name);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RenameFieldInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameFieldInfo>(new RenameFieldInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(400, "column_path", result->column_path);
	deserializer.ReadPropertyWithDefault<string>(401, "new_name", result->new_name);
	return std::move(result);
}